

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O1

Bool prvTidyIsCSS1Selector(ctmbstr buf)

{
  byte bVar1;
  bool bVar2;
  Bool BVar3;
  ushort **ppuVar4;
  int iVar5;
  bool bVar6;
  long lVar7;
  int iVar8;
  
  BVar3 = yes;
  lVar7 = 0;
  iVar8 = 0;
  do {
    bVar1 = buf[lVar7];
    bVar6 = true;
    if (bVar1 == 0x5c) {
      iVar8 = 1;
    }
    else {
      if (bVar1 == 0) {
        return BVar3;
      }
      ppuVar4 = __ctype_b_loc();
      if (((*ppuVar4)[bVar1] >> 0xb & 1) == 0) {
        bVar2 = iVar8 < 1;
        iVar8 = 0;
        if (bVar2) {
          bVar6 = (bool)((0xa0 < bVar1 || (ulong)bVar1 == 0x2d && (int)lVar7 != 0) |
                        (byte)((*ppuVar4)[bVar1] >> 10) & 1);
        }
      }
      else {
        iVar5 = (uint)(0 < iVar8) + iVar8;
        if (iVar8 < 5) {
          bVar6 = 0 < iVar5 || (int)lVar7 != 0;
          iVar8 = iVar5;
        }
        else {
          bVar6 = false;
          iVar8 = iVar5;
        }
      }
    }
    BVar3 = (Bool)bVar6;
    lVar7 = lVar7 + 1;
  } while (bVar6 != false);
  return BVar3;
}

Assistant:

Bool TY_(IsCSS1Selector)( ctmbstr buf )
{
    Bool valid = yes;
    int esclen = 0;
    byte c;
    int pos;

    for ( pos=0; valid && (c = *buf++); ++pos )
    {
        if ( c == '\\' )
        {
            esclen = 1;  /* ab\555\444 is 4 chars {'a', 'b', \555, \444} */
        }
        else if ( isdigit( c ) )
        {
            /* Digit not 1st, unless escaped (Max length "\112F") */
            if ( esclen > 0 )
                valid = ( ++esclen < 6 );
            if ( valid )
                valid = ( pos>0 || esclen>0 );
        }
        else
        {
            valid = (
                esclen > 0                       /* Escaped? Anything goes. */
                || ( pos>0 && c == '-' )         /* Dash cannot be 1st char */
                || isalpha(c)                    /* a-z, A-Z anywhere */
                || ( c >= 161 )                  /* Unicode 161-255 anywhere */
            );
            esclen = 0;
        }
    }
    return valid;
}